

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O3

TValue * lj_clib_index(lua_State *L,CLibrary *cl,GCstr *name)

{
  long *plVar1;
  ushort uVar2;
  uint uVar3;
  GCtab *pGVar4;
  CTypeID CVar5;
  CType *in_RAX;
  GCobj *o;
  TValue *pTVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  CTState *cts;
  lua_Number lVar10;
  CType *ct;
  CType *local_38;
  
  local_38 = in_RAX;
  pTVar6 = lj_tab_setstr(L,cl->cache,name);
  if ((pTVar6->field_2).it == 0xffffffff) {
    cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
    cts->L = L;
    CVar5 = lj_ctype_getname(cts,&local_38,name,0x1840);
    if (CVar5 == 0) {
      lj_err_callerv(L,LJ_ERR_FFI_NODECL,name + 1);
    }
    if ((local_38->info & 0xf0000000) == 0xb0000000) {
      uVar3 = local_38->size;
      if (((int)uVar3 < 0 &
          *(byte *)((long)&cts->tab->info + (ulong)((local_38->info & 0xffff) << 4) + 2) >> 7) == 1)
      {
        lVar10 = (lua_Number)uVar3;
      }
      else {
        lVar10 = (lua_Number)(int)uVar3;
      }
      pTVar6->n = lVar10;
    }
    else {
      uVar2 = local_38->sib;
      if (uVar2 != 0) {
        if ((cts->tab[uVar2].info & 0xf0ff0000) == 0x80040000) {
          name = (GCstr *)(ulong)cts->tab[uVar2].name.gcptr32;
        }
      }
      lVar7 = dlsym(cl->handle,name + 1);
      if (lVar7 == 0) {
        clib_error_(L);
      }
      pvVar8 = lj_mem_newgco(cts->L,0x10);
      *(undefined1 *)((long)pvVar8 + 5) = 10;
      *(short *)((long)pvVar8 + 6) = (short)CVar5;
      plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
      *plVar1 = *plVar1 + 1;
      *(long *)((long)pvVar8 + 8) = lVar7;
      (pTVar6->u32).lo = (uint32_t)pvVar8;
      (pTVar6->field_2).it = 0xfffffff5;
      pGVar4 = cl->cache;
      if ((pGVar4->marked & 4) != 0) {
        uVar9 = (ulong)(L->glref).ptr32;
        pGVar4->marked = pGVar4->marked & 0xfb;
        (pGVar4->gclist).gcptr32 = *(uint32_t *)(uVar9 + 0x6c);
        *(int *)(uVar9 + 0x6c) = (int)pGVar4;
      }
    }
  }
  return pTVar6;
}

Assistant:

TValue *lj_clib_index(lua_State *L, CLibrary *cl, GCstr *name)
{
  TValue *tv = lj_tab_setstr(L, cl->cache, name);
  if (LJ_UNLIKELY(tvisnil(tv))) {
    CTState *cts = ctype_cts(L);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    if (!id)
      lj_err_callerv(L, LJ_ERR_FFI_NODECL, strdata(name));
    if (ctype_isconstval(ct->info)) {
      CType *ctt = ctype_child(cts, ct);
      lj_assertCTS(ctype_isinteger(ctt->info) && ctt->size <= 4,
		   "only 32 bit const supported");  /* NYI */
      if ((ctt->info & CTF_UNSIGNED) && (int32_t)ct->size < 0)
	setnumV(tv, (lua_Number)(uint32_t)ct->size);
      else
	setintV(tv, (int32_t)ct->size);
    } else {
      const char *sym = clib_extsym(cts, ct, name);
#if LJ_TARGET_WINDOWS
      DWORD oldwerr = GetLastError();
#endif
      void *p = clib_getsym(cl, sym);
      GCcdata *cd;
      lj_assertCTS(ctype_isfunc(ct->info) || ctype_isextern(ct->info),
		   "unexpected ctype %08x in clib", ct->info);
#if LJ_TARGET_X86 && LJ_ABI_WIN
      /* Retry with decorated name for fastcall/stdcall functions. */
      if (!p && ctype_isfunc(ct->info)) {
	CTInfo cconv = ctype_cconv(ct->info);
	if (cconv == CTCC_FASTCALL || cconv == CTCC_STDCALL) {
	  CTSize sz = clib_func_argsize(cts, ct);
	  const char *symd = lj_strfmt_pushf(L,
			       cconv == CTCC_FASTCALL ? "@%s@%d" : "_%s@%d",
			       sym, sz);
	  L->top--;
	  p = clib_getsym(cl, symd);
	}
      }
#endif
      if (!p)
	clib_error(L, "cannot resolve symbol " LUA_QS ": %s", sym);
#if LJ_TARGET_WINDOWS
      SetLastError(oldwerr);
#endif
      cd = lj_cdata_new(cts, id, CTSIZE_PTR);
      *(void **)cdataptr(cd) = p;
      setcdataV(L, tv, cd);
      lj_gc_anybarriert(L, cl->cache);
    }
  }
  return tv;
}